

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_ThreeColourTriplets_TestShell::
~TEST_DoublingFactorCounterTest_ThreeColourTriplets_TestShell
          (TEST_DoublingFactorCounterTest_ThreeColourTriplets_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeColourTriplets)
{
	addPair(Tile::WestWind);
	addSequence(Tile::SevenOfCharacters, true);
	addTriplet(Tile::ThreeOfCharacters, true);
	addTriplet(Tile::ThreeOfCircles, false);
	addQuad(Tile::ThreeOfBamboos, false);	

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeColourTriplets));
	CHECK_EQUAL(2, r.doubling_factor);
}